

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<ProFile*>::emplace<ProFile*&>
          (QPodArrayOps<ProFile_*> *this,qsizetype i,ProFile **args)

{
  undefined1 uVar1;
  qsizetype qVar2;
  ProFile **ppPVar3;
  undefined8 *in_RDX;
  long in_RSI;
  QArrayDataPointer<ProFile_*> *in_RDI;
  ProFile **where;
  GrowthPosition pos;
  ProFile *tmp;
  bool detach;
  QArrayDataPointer<ProFile_*> *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar4;
  ProFile *pPVar5;
  undefined7 in_stack_ffffffffffffffe0;
  
  uVar1 = QArrayDataPointer<ProFile_*>::needsDetach(in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->size) &&
       (qVar2 = QArrayDataPointer<ProFile_*>::freeSpaceAtEnd(in_stack_ffffffffffffffc8), qVar2 != 0)
       ) {
      ppPVar3 = QArrayDataPointer<ProFile_*>::end(in_RDI);
      *ppPVar3 = (ProFile *)*in_RDX;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
    if ((in_RSI == 0) &&
       (qVar2 = QArrayDataPointer<ProFile_*>::freeSpaceAtBegin(in_stack_ffffffffffffffc8),
       qVar2 != 0)) {
      ppPVar3 = QArrayDataPointer<ProFile_*>::begin((QArrayDataPointer<ProFile_*> *)0x306b87);
      ppPVar3[-1] = (ProFile *)*in_RDX;
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
  }
  pPVar5 = (ProFile *)*in_RDX;
  uVar4 = 0;
  if ((in_RDI->size != 0) && (in_RSI == 0)) {
    uVar4 = 1;
  }
  QArrayDataPointer<ProFile_*>::detachAndGrow
            ((QArrayDataPointer<ProFile_*> *)CONCAT17(uVar1,in_stack_ffffffffffffffe0),
             (GrowthPosition)((ulong)pPVar5 >> 0x20),CONCAT44(uVar4,in_stack_ffffffffffffffd0),
             (ProFile ***)in_stack_ffffffffffffffc8,in_RDI);
  ppPVar3 = QPodArrayOps<ProFile_*>::createHole
                      ((QPodArrayOps<ProFile_*> *)CONCAT17(uVar1,in_stack_ffffffffffffffe0),
                       (GrowthPosition)((ulong)pPVar5 >> 0x20),
                       CONCAT44(uVar4,in_stack_ffffffffffffffd0),
                       (qsizetype)in_stack_ffffffffffffffc8);
  *ppPVar3 = pPVar5;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }